

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvn.cpp
# Opt level: O1

int __thiscall ncnn::MVN::forward(MVN *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  float fVar1;
  int _h;
  uint _c;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  size_t sVar5;
  Allocator *pAVar6;
  int iVar7;
  int iVar8;
  void *pvVar9;
  int *piVar10;
  long lVar11;
  uint uVar12;
  ulong uVar13;
  void *pvVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  float fVar18;
  void *ptr;
  Mat sum;
  void *local_88;
  size_t local_80;
  void *local_78;
  undefined8 uStack_70;
  undefined4 uStack_68;
  undefined4 uStack_64;
  undefined4 uStack_60;
  Allocator *local_58;
  undefined4 uStack_50;
  uint uStack_4c;
  undefined8 local_48;
  long lStack_40;
  Option *local_38;
  
  iVar8 = bottom_blob->w;
  _h = bottom_blob->h;
  _c = bottom_blob->c;
  uVar17 = (ulong)_c;
  local_80 = bottom_blob->elemsize;
  local_38 = opt;
  Mat::create(top_blob,iVar8,_h,_c,local_80,opt->blob_allocator);
  if (top_blob->data == (void *)0x0) {
    return -100;
  }
  if ((long)top_blob->c * top_blob->cstep == 0) {
    return -100;
  }
  lVar11 = (long)(int)_c;
  local_58 = local_38->workspace_allocator;
  local_78 = (void *)0x0;
  uStack_70._0_4_ = 0;
  uStack_70._4_4_ = 0;
  uStack_70 = (int *)0x0;
  uStack_68 = (undefined4)local_80;
  uStack_64 = (undefined4)(local_80 >> 0x20);
  uStack_60 = 1;
  _uStack_50 = CONCAT44(_c,1);
  local_48 = 0x100000001;
  lStack_40 = lVar11;
  if (_c != 0) {
    uVar16 = local_80 * lVar11 + 3 & 0xfffffffffffffffc;
    if (local_58 == (Allocator *)0x0) {
      local_88 = (void *)0x0;
      iVar7 = posix_memalign(&local_88,0x10,uVar16 + 4);
      local_78 = local_88;
      if (iVar7 != 0) {
        local_88 = (void *)0x0;
        local_78 = local_88;
      }
    }
    else {
      local_78 = (void *)(**(code **)(*(long *)local_58 + 0x10))();
    }
    uStack_70 = (int *)((long)local_78 + uVar16);
    *(undefined4 *)((long)local_78 + uVar16) = 1;
  }
  iVar7 = -100;
  if ((local_78 == (void *)0x0) || (local_48._4_4_ * lStack_40 == 0)) goto LAB_00136e9e;
  uVar12 = _h * iVar8;
  uVar16 = (ulong)uVar12;
  if (0 < (int)_c) {
    pvVar9 = bottom_blob->data;
    sVar2 = bottom_blob->cstep;
    sVar3 = bottom_blob->elemsize;
    uVar13 = 0;
    do {
      fVar18 = 0.0;
      if (0 < (int)uVar12) {
        uVar15 = 0;
        do {
          fVar18 = fVar18 + *(float *)((long)pvVar9 + uVar15 * 4);
          uVar15 = uVar15 + 1;
        } while (uVar16 != uVar15);
      }
      *(float *)((long)local_78 + uVar13 * 4) = fVar18;
      uVar13 = uVar13 + 1;
      pvVar9 = (void *)((long)pvVar9 + sVar2 * sVar3);
    } while (uVar13 != uVar17);
  }
  if (this->across_channels == 0) {
    if (0 < (int)_c) {
      pvVar9 = bottom_blob->data;
      sVar2 = bottom_blob->cstep;
      pvVar14 = top_blob->data;
      sVar3 = top_blob->cstep;
      sVar4 = top_blob->elemsize;
      sVar5 = bottom_blob->elemsize;
      uVar13 = 0;
      do {
        if (0 < (int)uVar12) {
          fVar18 = *(float *)((long)local_78 + uVar13 * 4);
          uVar15 = 0;
          do {
            *(float *)((long)pvVar14 + uVar15 * 4) =
                 *(float *)((long)pvVar9 + uVar15 * 4) - fVar18 * (1.0 / (float)(int)uVar12);
            uVar15 = uVar15 + 1;
          } while (uVar16 != uVar15);
        }
        uVar13 = uVar13 + 1;
        pvVar14 = (void *)((long)pvVar14 + sVar3 * sVar4);
        pvVar9 = (void *)((long)pvVar9 + sVar2 * sVar5);
      } while (uVar13 != uVar17);
    }
  }
  else {
    fVar18 = 0.0;
    if (0 < (int)_c) {
      uVar13 = 0;
      do {
        fVar18 = fVar18 + *(float *)((long)local_78 + uVar13 * 4);
        uVar13 = uVar13 + 1;
      } while (uVar17 != uVar13);
    }
    if (0 < (int)_c) {
      pvVar9 = bottom_blob->data;
      sVar2 = bottom_blob->cstep;
      sVar3 = top_blob->cstep;
      sVar4 = top_blob->elemsize;
      pvVar14 = top_blob->data;
      sVar5 = bottom_blob->elemsize;
      uVar13 = 0;
      do {
        if (0 < (int)uVar12) {
          uVar15 = 0;
          do {
            *(float *)((long)pvVar14 + uVar15 * 4) =
                 *(float *)((long)pvVar9 + uVar15 * 4) - fVar18 / (float)(int)(_c * uVar12);
            uVar15 = uVar15 + 1;
          } while (uVar16 != uVar15);
        }
        uVar13 = uVar13 + 1;
        pvVar14 = (void *)((long)pvVar14 + sVar3 * sVar4);
        pvVar9 = (void *)((long)pvVar9 + sVar2 * sVar5);
      } while (uVar13 != uVar17);
    }
  }
  if (this->normalize_variance != 0) {
    pAVar6 = local_38->workspace_allocator;
    if (_c == 0) {
      piVar10 = (int *)0x0;
      pvVar9 = (void *)0x0;
    }
    else {
      uVar13 = local_80 * lVar11 + 3 & 0xfffffffffffffffc;
      if (pAVar6 == (Allocator *)0x0) {
        local_88 = (void *)0x0;
        iVar8 = posix_memalign(&local_88,0x10,uVar13 + 4);
        pvVar9 = local_88;
        if (iVar8 != 0) {
          local_88 = (void *)0x0;
          pvVar9 = local_88;
        }
      }
      else {
        pvVar9 = (void *)(**(code **)(*(long *)pAVar6 + 0x10))(pAVar6,uVar13 + 4);
      }
      piVar10 = (int *)((long)pvVar9 + uVar13);
      *(undefined4 *)((long)pvVar9 + uVar13) = 1;
    }
    iVar7 = -100;
    if (_c == 0 || pvVar9 == (void *)0x0) {
      if (piVar10 != (int *)0x0) {
        LOCK();
        *piVar10 = *piVar10 + -1;
        UNLOCK();
        if (*piVar10 == 0) {
          if (pAVar6 == (Allocator *)0x0) {
            if (pvVar9 != (void *)0x0) {
              free(pvVar9);
              iVar7 = -100;
            }
          }
          else {
            (**(code **)(*(long *)pAVar6 + 0x18))(pAVar6,pvVar9);
            iVar7 = -100;
          }
        }
      }
      goto LAB_00136e9e;
    }
    if (0 < (int)_c) {
      pvVar14 = top_blob->data;
      sVar2 = top_blob->cstep;
      sVar3 = top_blob->elemsize;
      uVar13 = 0;
      do {
        fVar18 = 0.0;
        if (0 < (int)uVar12) {
          uVar15 = 0;
          do {
            fVar1 = *(float *)((long)pvVar14 + uVar15 * 4);
            fVar18 = fVar18 + fVar1 * fVar1;
            uVar15 = uVar15 + 1;
          } while (uVar16 != uVar15);
        }
        *(float *)((long)pvVar9 + uVar13 * 4) = fVar18;
        uVar13 = uVar13 + 1;
        pvVar14 = (void *)((long)pvVar14 + sVar2 * sVar3);
      } while (uVar13 != uVar17);
    }
    if (this->across_channels == 0) {
      if (0 < (int)_c) {
        pvVar14 = top_blob->data;
        sVar2 = top_blob->cstep;
        sVar3 = top_blob->elemsize;
        uVar13 = 0;
        do {
          if (0 < (int)uVar12) {
            fVar18 = *(float *)((long)pvVar9 + uVar13 * 4);
            fVar1 = this->eps;
            uVar15 = 0;
            do {
              *(float *)((long)pvVar14 + uVar15 * 4) =
                   *(float *)((long)pvVar14 + uVar15 * 4) *
                   (1.0 / (SQRT(fVar18 * (1.0 / (float)(int)uVar12)) + fVar1));
              uVar15 = uVar15 + 1;
            } while (uVar16 != uVar15);
          }
          uVar13 = uVar13 + 1;
          pvVar14 = (void *)((long)pvVar14 + sVar2 * sVar3);
        } while (uVar13 != uVar17);
      }
    }
    else {
      fVar18 = 0.0;
      if (0 < (int)_c) {
        uVar13 = 0;
        do {
          fVar18 = fVar18 + *(float *)((long)pvVar9 + uVar13 * 4);
          uVar13 = uVar13 + 1;
        } while (uVar17 != uVar13);
      }
      if (0 < (int)_c) {
        fVar1 = this->eps;
        sVar2 = top_blob->cstep;
        sVar3 = top_blob->elemsize;
        pvVar14 = top_blob->data;
        uVar13 = 0;
        do {
          if (0 < (int)uVar12) {
            uVar15 = 0;
            do {
              *(float *)((long)pvVar14 + uVar15 * 4) =
                   *(float *)((long)pvVar14 + uVar15 * 4) *
                   (1.0 / (SQRT(fVar18 / (float)(int)(_c * uVar12)) + fVar1));
              uVar15 = uVar15 + 1;
            } while (uVar16 != uVar15);
          }
          uVar13 = uVar13 + 1;
          pvVar14 = (void *)((long)pvVar14 + sVar2 * sVar3);
        } while (uVar13 != uVar17);
      }
    }
    if (piVar10 != (int *)0x0) {
      LOCK();
      *piVar10 = *piVar10 + -1;
      UNLOCK();
      if (*piVar10 == 0) {
        if (pAVar6 == (Allocator *)0x0) {
          if (pvVar9 != (void *)0x0) {
            free(pvVar9);
          }
        }
        else {
          (**(code **)(*(long *)pAVar6 + 0x18))(pAVar6,pvVar9);
        }
      }
    }
    iVar7 = -100;
    if (_c == 0 || pvVar9 == (void *)0x0) goto LAB_00136e9e;
  }
  iVar7 = 0;
LAB_00136e9e:
  if (uStack_70 != (int *)0x0) {
    LOCK();
    *uStack_70 = *uStack_70 + -1;
    UNLOCK();
    if (*uStack_70 == 0) {
      if (local_58 == (Allocator *)0x0) {
        if (local_78 != (void *)0x0) {
          free(local_78);
        }
      }
      else {
        (**(code **)(*(long *)local_58 + 0x18))();
      }
    }
  }
  return iVar7;
}

Assistant:

int MVN::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;
    int size = w * h;

    top_blob.create(w, h, channels, elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    // prepare sum per channel
    Mat sum(channels, elemsize, opt.workspace_allocator);
    if (sum.empty())
        return -100;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q=0; q<channels; q++)
    {
        const float* ptr = bottom_blob.channel(q);

        float s = 0.f;
        for (int i=0; i<size; i++)
        {
            s += ptr[i];
        }

        sum[q] = s;
    }

    if (across_channels)
    {
        // compute mean across channels
        float mean = 0.f;
        for (int q=0; q<channels; q++)
        {
            mean += sum[q];
        }
        mean = mean / (channels * size);

        // subtract mean
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q=0; q<channels; q++)
        {
            const float* ptr = bottom_blob.channel(q);
            float* outptr = top_blob.channel(q);

            for (int i=0; i<size; i++)
            {
                outptr[i] = ptr[i] - mean;
            }
        }
    }
    else
    {
        // subtract mean
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q=0; q<channels; q++)
        {
            const float* ptr = bottom_blob.channel(q);
            float* outptr = top_blob.channel(q);
            float mean = sum[q] / size;

            for (int i=0; i<size; i++)
            {
                outptr[i] = ptr[i] - mean;
            }
        }
    }

    if (normalize_variance)
    {
        // prepare squared sum per channel
        Mat sqsum(channels, elemsize, opt.workspace_allocator);
        if (sqsum.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q=0; q<channels; q++)
        {
            const float* ptr = top_blob.channel(q);

            float s = 0.f;
            for (int i=0; i<size; i++)
            {
                s += ptr[i] * ptr[i];
            }

            sqsum[q] = s;
        }

        if (across_channels)
        {
            // compute squared mean across channels
            float sqmean = 0.f;
            for (int q=0; q<channels; q++)
            {
                sqmean += sqsum[q];
            }
            sqmean = sqmean / (channels * size);

            // normalize variance
            float norm_var = static_cast<float>(sqrt(sqmean) + eps);
            float norm_var_inv = 1.f / norm_var;

            // apply normalize_variance
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q=0; q<channels; q++)
            {
                float* outptr = top_blob.channel(q);

                for (int i=0; i<size; i++)
                {
                    outptr[i] = outptr[i] * norm_var_inv;
                }
            }
        }
        else
        {
            // apply normalize_variance
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q=0; q<channels; q++)
            {
                float* outptr = top_blob.channel(q);
                float sqmean = sqsum[q] / size;
                float norm_var = static_cast<float>(sqrt(sqmean) + eps);
                float norm_var_inv = 1.f / norm_var;

                for (int i=0; i<size; i++)
                {
                    outptr[i] = outptr[i] * norm_var_inv;
                }
            }
        }

    }

    return 0;
}